

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O3

void disruptor::test::SingleThreadedStrategy::IncrementAndGet_invoker(void)

{
  undefined8 uVar1;
  IncrementAndGet t;
  string local_498;
  undefined7 uStack_497;
  undefined1 local_488 [16];
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  string local_428;
  undefined7 uStack_427;
  undefined1 local_418 [96];
  ios_base local_3b8 [264];
  undefined1 *local_2b0;
  long local_2a8;
  undefined1 local_2a0 [16];
  undefined1 *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 local_240 [176];
  atomic<long> local_190;
  atomic<long> local_118;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [24];
  atomic<long> local_a0;
  undefined1 local_60 [16];
  pointer local_50;
  size_t local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_430 = "";
  memset((ostringstream *)local_240,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
  local_c0 = 0;
  local_b8[0] = 0;
  local_428 = (string)0x22;
  local_c8 = local_b8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,(char *)&local_428,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"IncrementAndGet",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_240,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_c8,&local_428);
  if ((undefined1 *)CONCAT71(uStack_427,local_428) != local_418) {
    operator_delete((undefined1 *)CONCAT71(uStack_427,local_428));
  }
  local_250 = local_c8;
  local_248 = local_c8 + local_c0;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_438,0x3f);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
  std::ios_base::~ios_base((ios_base *)(local_240 + 0x70));
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_240._56_8_ = -1;
  local_190.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_118.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_a0.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  local_60 = (undefined1  [16])0x0;
  local_50 = (pointer)0x0;
  local_48 = 8;
  local_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  uStack_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_440 = "";
  memset((ostringstream *)&local_428,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
  local_2a8 = 0;
  local_2a0[0] = 0;
  local_498 = (string)0x22;
  local_2b0 = local_2a0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,(char *)&local_498,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"IncrementAndGet",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2b0,&local_498);
  if ((undefined1 *)CONCAT71(uStack_497,local_498) != local_488) {
    operator_delete((undefined1 *)CONCAT71(uStack_497,local_498));
  }
  local_260 = local_2b0;
  local_258 = local_2b0 + local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_448,0x3f);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
  std::ios_base::~ios_base(local_3b8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_458 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_450 = "";
  memset((ostringstream *)&local_428,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
  local_2a8 = 0;
  local_2a0[0] = 0;
  local_498 = (string)0x22;
  local_2b0 = local_2a0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,(char *)&local_498,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"IncrementAndGet",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2b0,&local_498);
  if ((undefined1 *)CONCAT71(uStack_497,local_498) != local_488) {
    operator_delete((undefined1 *)CONCAT71(uStack_497,local_498));
  }
  local_270 = local_2b0;
  local_268 = local_2b0 + local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_458,0x3f);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
  std::ios_base::~ios_base(local_3b8);
  IncrementAndGet::test_method((IncrementAndGet *)local_240);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_460 = "";
  memset((ostringstream *)&local_428,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
  local_2a8 = 0;
  local_2a0[0] = 0;
  local_498 = (string)0x22;
  local_2b0 = local_2a0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,(char *)&local_498,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"IncrementAndGet",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_428,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2b0,&local_498);
  if ((undefined1 *)CONCAT71(uStack_497,local_498) != local_488) {
    operator_delete((undefined1 *)CONCAT71(uStack_497,local_498));
  }
  local_280 = local_2b0;
  local_278 = local_2b0 + local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_468,0x3f);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
  std::ios_base::~ios_base(local_3b8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/claim_strategy_test.cc"
  ;
  local_470 = "";
  memset((ostringstream *)&local_428,0,0x198);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_428);
  local_2a8 = 0;
  local_2a0[0] = 0;
  local_498 = (string)0x22;
  local_2b0 = local_2a0;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,(char *)&local_498,1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"IncrementAndGet",0xf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_428,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2b0,&local_498);
  if ((undefined1 *)CONCAT71(uStack_497,local_498) != local_488) {
    operator_delete((undefined1 *)CONCAT71(uStack_497,local_498));
  }
  local_290 = local_2b0;
  local_288 = local_2b0 + local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_478,0x3f);
  if (local_2b0 != local_2a0) {
    operator_delete(local_2b0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_428);
  std::ios_base::~ios_base(local_3b8);
  if ((pointer)local_60._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_60._0_8_);
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(IncrementAndGet) {
  int64_t return_value = strategy.IncrementAndGet(cursor, empty_dependents);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue);

  const size_t delta = 10;
  return_value = strategy.IncrementAndGet(cursor, empty_dependents, delta);
  BOOST_CHECK_EQUAL(return_value, kFirstSequenceValue + delta);
}